

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void drawnumber_motionfn(void *z,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  float fVar1;
  _instancetemplate *p_Var2;
  t_scalar *ptVar3;
  _glist *owner;
  t_template *template;
  _array *a;
  int iVar4;
  t_symbol *s;
  t_atom at;
  t_atom local_30;
  
  if ((up == 0.0) && (!NAN(up))) {
    iVar4 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
    if (iVar4 == 0) {
      post("drawnumber_motion: scalar disappeared");
      return;
    }
    p_Var2 = (pd_maininstance.pd_gui)->i_template;
    if (*(int *)(p_Var2 + 0x108) == 0) {
      fVar1 = *(float *)(p_Var2 + 0xc0);
      *(float *)(p_Var2 + 0xc0) = fVar1 - dy;
      template_setfloat(*(t_template **)(p_Var2 + 0xe8),*(t_symbol **)((long)z + 0x30),
                        *(t_word **)(p_Var2 + 0xe0),fVar1 - dy,1);
      p_Var2 = (pd_maininstance.pd_gui)->i_template;
      ptVar3 = *(t_scalar **)(p_Var2 + 0xd0);
      if (ptVar3 != (t_scalar *)0x0) {
        owner = *(_glist **)(p_Var2 + 200);
        template = *(t_template **)(p_Var2 + 0xe8);
        s = gensym("change");
        template_notifyforscalar(template,owner,ptVar3,s,1,&local_30);
      }
      ptVar3 = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0);
      if (ptVar3 != (t_scalar *)0x0) {
        scalar_redraw(ptVar3,*(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
      a = *(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8);
      if (a != (_array *)0x0) {
        array_redraw(a,*(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
    }
  }
  return;
}

Assistant:

static void drawnumber_motionfn(void *z, t_floatarg dx, t_floatarg dy,
    t_floatarg up)
{
    t_drawnumber *x = (t_drawnumber *)z;
    t_atom at;
    if (up != 0)
        return;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (TEMPLATE->drawnumber_motion_type != DT_FLOAT)
        return;
    TEMPLATE->drawnumber_motion_ycumulative -= dy;
    template_setfloat(TEMPLATE->drawnumber_motion_template,
        x->x_fieldname,
            TEMPLATE->drawnumber_motion_wp,
            TEMPLATE->drawnumber_motion_ycumulative,
                1);
    if (TEMPLATE->drawnumber_motion_scalar)
        template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
            TEMPLATE->drawnumber_motion_glist,
                TEMPLATE->drawnumber_motion_scalar,
                gensym("change"), 1, &at);

    if (TEMPLATE->drawnumber_motion_scalar)
        scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
            TEMPLATE->drawnumber_motion_glist);
    if (TEMPLATE->drawnumber_motion_array)
        array_redraw(TEMPLATE->drawnumber_motion_array,
            TEMPLATE->drawnumber_motion_glist);
}